

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowererMDArch.cpp
# Opt level: O0

void __thiscall
LowererMDArch::EmitUIntToFloat(LowererMDArch *this,Opnd *dst,Opnd *src,Instr *instrInsert)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegOpnd *dstOpnd;
  Instr *pIVar4;
  Opnd *src1Opnd;
  OpCode opcode;
  RegOpnd *tempReg;
  Instr *instrInsert_local;
  Opnd *src_local;
  Opnd *dst_local;
  LowererMDArch *this_local;
  
  bVar2 = IR::Opnd::IsRegOpnd(dst);
  if ((!bVar2) || (bVar2 = IR::Opnd::IsFloat(dst), !bVar2)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0xa57,"(dst->IsRegOpnd() && dst->IsFloat())",
                       "dst->IsRegOpnd() && dst->IsFloat()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = IR::Opnd::IsRegOpnd(src);
  if ((!bVar2) ||
     ((bVar2 = IR::Opnd::IsInt32(src), !bVar2 && (bVar2 = IR::Opnd::IsUInt32(src), !bVar2)))) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/LowererMDArch.cpp"
                       ,0xa58,"(src->IsRegOpnd() && (src->IsInt32() || src->IsUInt32()))",
                       "src->IsRegOpnd() && (src->IsInt32() || src->IsUInt32())");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  dstOpnd = IR::RegOpnd::New(TyInt32,this->m_func);
  pIVar4 = IR::Instr::New(MOV_TRUNC,&dstOpnd->super_Opnd,src,this->m_func);
  IR::Instr::InsertBefore(instrInsert,pIVar4);
  bVar2 = IR::Opnd::IsFloat64(dst);
  opcode = CVTSI2SS;
  if (bVar2) {
    opcode = CVTSI2SD;
  }
  src1Opnd = IR::Opnd::UseWithNewType(&dstOpnd->super_Opnd,TyInt64,this->m_func);
  pIVar4 = IR::Instr::New(opcode,dst,src1Opnd,this->m_func);
  IR::Instr::InsertBefore(instrInsert,pIVar4);
  return;
}

Assistant:

void
LowererMDArch::EmitUIntToFloat(IR::Opnd *dst, IR::Opnd *src, IR::Instr *instrInsert)
{
    Assert(dst->IsRegOpnd() && dst->IsFloat());
    Assert(src->IsRegOpnd() && (src->IsInt32() || src->IsUInt32()));

    // MOV tempReg.i32, src  - make sure the top bits are 0
    IR::RegOpnd * tempReg = IR::RegOpnd::New(TyInt32, this->m_func);
    instrInsert->InsertBefore(IR::Instr::New(Js::OpCode::MOV_TRUNC, tempReg, src, this->m_func));

    // CVTSI2SD dst, tempReg.i64  (Use the tempreg as if it is 64 bit without sign extension)
    instrInsert->InsertBefore(IR::Instr::New(dst->IsFloat64() ? Js::OpCode::CVTSI2SD : Js::OpCode::CVTSI2SS, dst,
        tempReg->UseWithNewType(TyInt64, this->m_func), this->m_func));
}